

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManAreRycycleSta(Gia_ManAre_t *p,Gia_StaAre_t *pSta)

{
  Gia_StaAre_t *pGVar1;
  Gia_StaAre_t *pSta_local;
  Gia_ManAre_t *p_local;
  
  memset(pSta,0,(long)(p->nSize << 2));
  pGVar1 = Gia_ManAreStaLast(p);
  if ((pSta == pGVar1) && (p->nStas = p->nStas + -1, p->nStas == (p->nStaPages + -1) * 0x100000)) {
    p->nStaPages = p->nStaPages + -1;
  }
  return;
}

Assistant:

static inline void Gia_ManAreRycycleSta( Gia_ManAre_t * p, Gia_StaAre_t * pSta )
{
    memset( pSta, 0, p->nSize << 2 );
    if ( pSta == Gia_ManAreStaLast(p) )
    {
        p->nStas--;
        if ( p->nStas == (p->nStaPages-1) * MAX_ITEM_NUM )
            p->nStaPages--;
    }
    else
    {
//        Gia_StaSetUnused( pSta );
    }
}